

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_move_grow.cpp
# Opt level: O3

void move_grow_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,bool reload_data,Am_Object *obj,
               Am_Value *new_val)

{
  bool growing;
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  ostream *poVar4;
  undefined7 in_register_00000011;
  Am_Inter_Location new_data;
  Am_Inter_Location old_data;
  Am_Inter_Location new_loc;
  Am_Object inter;
  Am_Inter_Location local_80;
  Am_Inter_Location local_78;
  Am_Inter_Location local_70;
  undefined4 local_64;
  Am_Object local_60;
  Am_Inter_Location local_58;
  Am_Object local_50;
  Am_Inter_Location local_48;
  Am_Object local_40;
  Am_Object local_38;
  
  local_64 = (undefined4)CONCAT71(in_register_00000011,selective);
  local_60.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&local_60,pAVar2);
  pAVar2 = Am_Object::Get(command_obj,0xda,0);
  growing = Am_Value::operator_cast_to_bool(pAVar2);
  Am_Inter_Location::Am_Inter_Location(&local_70);
  if (reload_data) {
    bVar1 = Am_Value::Valid(new_val);
    if (bVar1) {
      bVar1 = Am_Inter_Location::Test(new_val);
      if (!bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"New value for selective repeat of ",0x22);
        poVar4 = operator<<((ostream *)&std::cerr,command_obj);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4," is not Am_Inter_Location: ",0x1b);
        poVar4 = operator<<(poVar4,new_val);
        std::endl<char,std::char_traits<char>>(poVar4);
        Am_Error();
      }
      Am_Inter_Location::operator=(&local_70,new_val);
      pAVar2 = Am_Object::Get(&local_60,0xd3,0);
      bVar1 = Am_Value::operator_cast_to_bool(pAVar2);
      if (bVar1 && growing) {
        bVar1 = Am_Inter_Location::Is_Zero_Size(&local_70);
        if (bVar1) {
          Am_Object::Set(command_obj,0x166,true,1);
          Am_Object::Am_Object(&local_38,&Am_No_Object);
          Am_Beep(&local_38);
          Am_Object::~Am_Object(&local_38);
          goto LAB_001ba251;
        }
      }
    }
    bVar1 = Am_Object::Valid(obj);
    if (!bVar1) goto LAB_001ba064;
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(obj);
    Am_Object::Set(command_obj,0x16d,pAVar3,0);
  }
  else {
LAB_001ba064:
    pAVar2 = Am_Object::Get(command_obj,0x16d,0);
    Am_Object::operator=(obj,pAVar2);
  }
  bVar1 = Am_Object::Valid(obj);
  if (!bVar1) goto LAB_001ba251;
  Am_Inter_Location::Am_Inter_Location(&local_78);
  Am_Inter_Location::Am_Inter_Location(&local_80);
  Am_Object::Make_Unique(command_obj,0x16c);
  Am_Object::Make_Unique(command_obj,0x169);
  pAVar2 = Am_Object::Get(command_obj,0x16c,0);
  Am_Inter_Location::operator=(&local_78,pAVar2);
  if (reload_data) {
    bVar1 = Am_Inter_Location::Valid(&local_70);
    if (!bVar1) goto LAB_001ba118;
    Am_Inter_Location::operator=(&local_80,&local_70);
    pAVar3 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&local_80);
    Am_Object::Set(command_obj,0x169,pAVar3,0);
  }
  else {
LAB_001ba118:
    pAVar2 = Am_Object::Get(command_obj,0x169,0);
    Am_Inter_Location::operator=(&local_80,pAVar2);
  }
  if ((char)local_64 == '\0') {
    if (!undo) goto LAB_001ba1fe;
LAB_001ba18a:
    Am_Check_And_Fix_Owner_For_Object(obj,&local_78);
    Am_Inter_Location::Install(&local_78,obj,growing);
    Am_Inter_Location::Swap_With(&local_80,&local_78,false);
LAB_001ba223:
    Am_Object::Note_Changed(command_obj,0x16c);
    Am_Object::Note_Changed(command_obj,0x169);
  }
  else {
    if (undo) {
      Am_Object::Am_Object(&local_40,obj);
      Am_Inter_Location::Am_Inter_Location(&local_48,&local_80);
      Am_Set_Data_From_Object(&local_40,&local_48,growing);
      Am_Inter_Location::~Am_Inter_Location(&local_48);
      Am_Object::~Am_Object(&local_40);
      goto LAB_001ba18a;
    }
    Am_Object::Am_Object(&local_50,obj);
    Am_Inter_Location::Am_Inter_Location(&local_58,&local_78);
    Am_Set_Data_From_Object(&local_50,&local_58,growing);
    Am_Inter_Location::~Am_Inter_Location(&local_58);
    Am_Object::~Am_Object(&local_50);
LAB_001ba1fe:
    Am_Check_And_Fix_Owner_For_Object(obj,&local_80);
    Am_Inter_Location::Install(&local_80,obj,growing);
    if ((char)local_64 != '\0') goto LAB_001ba223;
  }
  Am_Inter_Location::~Am_Inter_Location(&local_80);
  Am_Inter_Location::~Am_Inter_Location(&local_78);
LAB_001ba251:
  Am_Inter_Location::~Am_Inter_Location(&local_70);
  Am_Object::~Am_Object(&local_60);
  return;
}

Assistant:

void
move_grow_general_undo_redo(Am_Object command_obj, bool undo, bool selective,
                            bool reload_data, Am_Object obj = Am_No_Object,
                            Am_Value new_val = Am_No_Value)
{
  Am_Object inter;
  inter = command_obj.Get(Am_SAVED_OLD_OWNER);
  bool growing = command_obj.Get(Am_GROWING);
  Am_Inter_Location new_loc;

  if (reload_data && new_val.Valid()) {
    if (!Am_Inter_Location::Test(new_val))
      Am_ERRORO("New value for selective repeat of "
                    << command_obj << " is not Am_Inter_Location: " << new_val,
                command_obj, Am_VALUE);
    new_loc = new_val;
    bool beep_on_abort = inter.Get(Am_INTER_BEEP_ON_ABORT);
    if (growing && beep_on_abort && new_loc.Is_Zero_Size()) {
      Am_INTER_TRACE_PRINT(inter, "Aborting " << command_obj
                                              << " because zero size");
      //not queued for undo
      command_obj.Set(Am_COMMAND_IS_ABORTING, true, Am_OK_IF_NOT_THERE);
      Am_Beep();
      return;
    }
  }

  if (reload_data && obj.Valid())
    command_obj.Set(Am_OBJECT_MODIFIED, obj);
  else
    obj = command_obj.Get(Am_OBJECT_MODIFIED);

#ifdef DEBUG
  if (inter.Valid() && Am_Inter_Tracing(inter)) {
    if (selective)
      std::cout << "Selective ";
    if (undo)
      std::cout << "Undo";
    else
      std::cout << "Redo";
    std::cout << " command " << command_obj << " on obj " << obj << std::endl
              << std::flush;
  }
#endif
  if (obj.Valid()) {
    Am_Inter_Location old_data, new_data;
    command_obj.Make_Unique(Am_OLD_VALUE); //will be destructively modifying
    command_obj.Make_Unique(Am_VALUE);     //these slots; make sure
                                           //not shared
    old_data = command_obj.Get(Am_OLD_VALUE);
    if (reload_data && new_loc.Valid()) {
      new_data = new_loc;
      command_obj.Set(Am_VALUE, new_data);
    } else
      new_data = command_obj.Get(Am_VALUE);

    if (selective) {
      if (undo)
        Am_Set_Data_From_Object(obj, new_data, growing);
      else
        Am_Set_Data_From_Object(obj, old_data, growing);
    }
    if (undo) {
      Am_Check_And_Fix_Owner_For_Object(obj, old_data);
#ifdef DEBUG
      if (growing != old_data.Get_Growing())
        Am_ERRORO("Growing in cmd " << command_obj << " != old_data growing "
                                    << old_data,
                  command_obj, Am_GROWING);
#endif
      Am_Modify_Object_Pos(obj, old_data, growing);
      // swap current and old values, in case undo or undo-the-undo again
      new_data.Swap_With(old_data, false);
      command_obj.Note_Changed(Am_OLD_VALUE);
      command_obj.Note_Changed(Am_VALUE);
    } else {
      Am_Check_And_Fix_Owner_For_Object(obj, new_data);
#ifdef DEBUG
      if (growing != new_data.Get_Growing())
        Am_ERRORO("Growing in cmd " << command_obj << " != new_data growing "
                                    << new_data,
                  command_obj, Am_GROWING);
#endif
      Am_Modify_Object_Pos(obj, new_data, growing);
      if (selective) {
        command_obj.Note_Changed(Am_OLD_VALUE);
        command_obj.Note_Changed(Am_VALUE);
      }
    }
  }
}